

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxalloc.h
# Opt level: O3

void soplex::spx_realloc<bool*>(bool **p,int n)

{
  bool *pbVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  pbVar1 = (bool *)realloc(*p,(ulong)(n + (uint)(n == 0)));
  if (pbVar1 != (bool *)0x0) {
    *p = pbVar1;
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"EMALLC02 realloc: Out of memory - cannot allocate ",0x32);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes",6);
  std::endl<char,std::char_traits<char>>(poVar2);
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"XMALLC02 realloc: Could not allocate enough memory","");
  *puVar3 = &PTR__SPxException_003adbd8;
  puVar3[1] = puVar3 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar3 + 1),local_40,local_40 + local_38);
  *puVar3 = &PTR__SPxException_003adbb0;
  __cxa_throw(puVar3,&SPxMemoryException::typeinfo,SPxException::~SPxException);
}

Assistant:

inline void spx_realloc(T& p, int n)
{
   assert(n >= 0);

   /* new pointer to not lose old one in case of problems */
   T pp;

   if(n == 0)
      n = 1;

   try
   {
      pp = reinterpret_cast<T>(realloc(p, sizeof(*p) * (unsigned int) n));
   }
   catch(const std::bad_alloc&)
   {
      throw(SPxMemoryException("Error reallocating memory"));
   }

   if(nullptr == pp)
   {
      std::cerr << "EMALLC02 realloc: Out of memory - cannot allocate "
                << sizeof(*p) * (unsigned int) n << " bytes" << std::endl;
      throw(SPxMemoryException("XMALLC02 realloc: Could not allocate enough memory"));
   }

   p = pp;
}